

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void nivalis::detail::sub_var_ast(AST *ast,int64_t addr,Expr *expr)

{
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar1;
  undefined4 uVar2;
  pointer pAVar3;
  ASTNode *__args;
  ulong uVar4;
  long lVar5;
  AST new_ast;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_48;
  
  local_48.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_48.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (ASTNode *)0x0;
  pAVar3 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
      _M_impl.super__Vector_impl_data._M_finish != pAVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if ((*(int *)((long)&pAVar3->opcode + lVar5) == 2) &&
         (*(long *)((long)&pAVar3->field_1 + lVar5) == addr)) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<nivalis::Expr::ASTNode_const*,std::back_insert_iterator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>
                  ((expr->ast).
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (expr->ast).
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        __args = (ASTNode *)((long)&pAVar3->opcode + lVar5);
        if (local_48.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_48.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
          _M_realloc_insert<nivalis::Expr::ASTNode_const&>
                    ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)
                     &local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          uVar2 = *(undefined4 *)&__args->field_0x4;
          aVar1 = __args->field_1;
          (local_48.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish)->opcode = __args->opcode;
          *(undefined4 *)
           &(local_48.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = uVar2;
          (local_48.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_1 = aVar1;
          local_48.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar4 = uVar4 + 1;
      pAVar3 = (ast->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(ast->
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4))
    ;
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator=
            (ast,&local_48);
  if (local_48.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sub_var_ast(Expr::AST& ast, int64_t addr, const Expr& expr) {
    Expr::AST new_ast;
    for (size_t i = 0; i < ast.size(); ++i) {
        if (ast[i].opcode == OpCode::ref &&
            ast[i].ref == addr) {
            std::copy(expr.ast.begin(), expr.ast.end(), std::back_inserter(new_ast));
        } else {
            new_ast.push_back(ast[i]);
        }
    }
    ast = new_ast;
}